

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O2

Id __thiscall
dxil_spv::SPIRVModule::Impl::build_coop_mat_clamp(Impl *this,SPIRVModule *module,Id type_id)

{
  Builder *this_00;
  Block *pBVar1;
  Id IVar2;
  Id pointee;
  Id typeId;
  Id id;
  pointer pCVar3;
  Function *parent;
  Instruction *pIVar4;
  Block *this_01;
  Block *this_02;
  Instruction *pIVar5;
  Instruction *this_03;
  Instruction *pIVar6;
  Instruction *pIVar7;
  Id IVar8;
  Block *entry;
  Id local_74;
  Id local_70;
  Id local_6c;
  CoopMatConvOp local_68;
  undefined8 local_58;
  vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  local_48;
  
  pCVar3 = (this->coop_mat_conv_ids).
           super__Vector_base<dxil_spv::SPIRVModule::Impl::CoopMatConvOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (pCVar3 == (this->coop_mat_conv_ids).
                  super__Vector_base<dxil_spv::SPIRVModule::Impl::CoopMatConvOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      this_00 = &this->builder;
      pBVar1 = (this->builder).buildPoint;
      entry = (Block *)0x0;
      IVar2 = spv::Builder::makeUintType(this_00,0x20);
      pointee = spv::Builder::makeFloatType(this_00,0x20);
      typeId = spv::Builder::makeBoolType(this_00);
      local_74 = spv::Builder::makePointer(this_00,StorageClassFunction,type_id);
      local_68.input_type = 0;
      local_68.output_type = 0;
      local_68.func_id = 0;
      local_68.call = DescriptorQACheck;
      local_58 = 0;
      local_70 = pointee;
      local_6c = pointee;
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_range_initialize<unsigned_int_const*>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&local_68,
                 &local_74);
      local_48.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      parent = spv::Builder::makeFunctionEntry
                         (this_00,DecorationMax,type_id,"CoopMatClamp",(Vector<Id> *)&local_68,
                          &local_48,&entry);
      std::
      vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ::~vector(&local_48);
      std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
                 &local_68);
      id = create_variable(this,StorageClassFunction,type_id,"coop_output");
      pIVar4 = spv::Builder::addInstruction(this_00,IVar2,OpCooperativeMatrixLengthKHR);
      spv::Instruction::addIdOperand(pIVar4,type_id);
      this_01 = (Block *)allocate_in_thread(0x78);
      IVar8 = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = IVar8;
      spv::Block::Block(this_01,IVar8,parent);
      this_02 = (Block *)allocate_in_thread(0x78);
      IVar8 = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = IVar8;
      spv::Block::Block(this_02,IVar8,parent);
      spv::Builder::createBranch(this_00,this_01);
      (this->builder).buildPoint = this_01;
      pIVar5 = spv::Builder::addInstruction(this_00,IVar2,OpPhi);
      this_03 = spv::Builder::addInstruction(this_00,IVar2,OpIAdd);
      spv::Instruction::addIdOperand(this_03,pIVar5->resultId);
      IVar2 = spv::Builder::makeUintConstant(this_00,1,false);
      spv::Instruction::addIdOperand(this_03,IVar2);
      IVar2 = spv::Builder::makeUintConstant(this_00,0,false);
      spv::Instruction::addIdOperand(pIVar5,IVar2);
      spv::Instruction::addIdOperand
                (pIVar5,*(Id *)((long)(((entry->instructions).
                                        super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                                      ._M_t + 8));
      spv::Instruction::addIdOperand(pIVar5,this_03->resultId);
      spv::Instruction::addIdOperand
                (pIVar5,*(Id *)((long)(((this_01->instructions).
                                        super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                                      ._M_t + 8));
      IVar2 = spv::Builder::makePointer(this_00,StorageClassFunction,pointee);
      pIVar6 = spv::Builder::addInstruction(this_00,IVar2,OpInBoundsAccessChain);
      spv::Instruction::addIdOperand
                (pIVar6,(*(parent->parameterInstructions).
                          super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_start)->resultId);
      spv::Instruction::addIdOperand(pIVar6,pIVar5->resultId);
      pIVar7 = spv::Builder::addInstruction(this_00,pointee,OpLoad);
      spv::Instruction::addIdOperand(pIVar7,pIVar6->resultId);
      IVar2 = spv::Builder::makePointer(this_00,StorageClassFunction,pointee);
      pIVar6 = spv::Builder::addInstruction(this_00,IVar2,OpInBoundsAccessChain);
      spv::Instruction::addIdOperand(pIVar6,id);
      spv::Instruction::addIdOperand(pIVar6,pIVar5->resultId);
      IVar2 = spv::Builder::import(this_00,"GLSL.std.450");
      pIVar5 = spv::Builder::addInstruction(this_00,pointee,OpExtInst);
      spv::Instruction::addIdOperand(pIVar5,IVar2);
      spv::Instruction::addImmediateOperand(pIVar5,0x2b);
      spv::Instruction::addIdOperand(pIVar5,pIVar7->resultId);
      spv::Instruction::addIdOperand
                (pIVar5,(parent->parameterInstructions).
                        super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]->resultId);
      spv::Instruction::addIdOperand
                (pIVar5,(parent->parameterInstructions).
                        super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[2]->resultId);
      pIVar7 = spv::Builder::addInstruction(this_00,OpStore);
      spv::Instruction::addIdOperand(pIVar7,pIVar6->resultId);
      spv::Instruction::addIdOperand(pIVar7,pIVar5->resultId);
      pIVar5 = spv::Builder::addInstruction(this_00,typeId,OpULessThan);
      spv::Instruction::addIdOperand(pIVar5,this_03->resultId);
      spv::Instruction::addIdOperand(pIVar5,pIVar4->resultId);
      spv::Builder::createLoopMerge(this_00,this_02,this_01,0);
      spv::Builder::createConditionalBranch(this_00,pIVar5->resultId,this_01,this_02);
      (this->builder).buildPoint = this_02;
      pIVar4 = spv::Builder::addInstruction(this_00,type_id,OpLoad);
      spv::Instruction::addIdOperand(pIVar4,id);
      spv::Builder::makeReturn(this_00,false,pIVar4->resultId);
      (this->builder).buildPoint = pBVar1;
      local_68.output_type = type_id;
      local_68.input_type = type_id;
      local_68.call = CoopMatClamp;
      local_68.func_id = (parent->functionInstruction).resultId;
      std::
      vector<dxil_spv::SPIRVModule::Impl::CoopMatConvOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>_>
      ::emplace_back<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>(&this->coop_mat_conv_ids,&local_68)
      ;
      return (parent->functionInstruction).resultId;
    }
    if ((pCVar3->input_type == type_id) && (pCVar3->call == CoopMatClamp)) break;
    pCVar3 = pCVar3 + 1;
  }
  return pCVar3->func_id;
}

Assistant:

spv::Id SPIRVModule::Impl::build_coop_mat_clamp(SPIRVModule &module, spv::Id type_id)
{
	for (auto &ops : coop_mat_conv_ids)
		if (ops.input_type == type_id && ops.call == HelperCall::CoopMatClamp)
			return ops.func_id;
	auto *current_build_point = builder.getBuildPoint();

	spv::Block *entry = nullptr;
	spv::Id uint_type = builder.makeUintType(32);
	spv::Id f32_type = builder.makeFloatType(32);
	spv::Id bool_type = builder.makeBoolType();

	// RADV workaround. It fails to understand coopmat passed as value.
	spv::Id float_ptr_type = builder.makePointer(spv::StorageClassFunction, type_id);

	auto *func = builder.makeFunctionEntry(spv::NoPrecision, type_id,
	                                       "CoopMatClamp",
	                                       { float_ptr_type, f32_type, f32_type }, {}, &entry);

	spv::Id output_id = create_variable(spv::StorageClassFunction, type_id, "coop_output");

	auto *len = builder.addInstruction(uint_type, spv::OpCooperativeMatrixLengthKHR);
	len->addIdOperand(type_id);

	auto *header = new spv::Block(builder.getUniqueId(), *func);
	auto *merge = new spv::Block(builder.getUniqueId(), *func);
	builder.createBranch(header);
	builder.setBuildPoint(header);
	{
		auto *phi = builder.addInstruction(uint_type, spv::OpPhi);
		auto *iter = builder.addInstruction(uint_type, spv::OpIAdd);
		iter->addIdOperand(phi->getResultId());
		iter->addIdOperand(builder.makeUintConstant(1));

		phi->addIdOperand(builder.makeUintConstant(0));
		phi->addIdOperand(entry->getId());
		phi->addIdOperand(iter->getResultId());
		phi->addIdOperand(header->getId());

		auto *input_chain = builder.addInstruction(
		    builder.makePointer(spv::StorageClassFunction, f32_type), spv::OpInBoundsAccessChain);
		input_chain->addIdOperand(func->getParamId(0));
		input_chain->addIdOperand(phi->getResultId());

		auto *load = builder.addInstruction(f32_type, spv::OpLoad);
		load->addIdOperand(input_chain->getResultId());

		auto *output_chain = builder.addInstruction(
		    builder.makePointer(spv::StorageClassFunction, f32_type), spv::OpInBoundsAccessChain);
		output_chain->addIdOperand(output_id);
		output_chain->addIdOperand(phi->getResultId());

		spv::Id std450 = builder.import("GLSL.std.450");
		auto *clamp = builder.addInstruction(f32_type, spv::OpExtInst);
		clamp->addIdOperand(std450);
		clamp->addImmediateOperand(GLSLstd450FClamp);
		clamp->addIdOperand(load->getResultId());
		clamp->addIdOperand(func->getParamId(1));
		clamp->addIdOperand(func->getParamId(2));

		auto *store = builder.addInstruction(spv::OpStore);
		store->addIdOperand(output_chain->getResultId());
		store->addIdOperand(clamp->getResultId());

		auto *cmp = builder.addInstruction(bool_type, spv::OpULessThan);
		cmp->addIdOperand(iter->getResultId());
		cmp->addIdOperand(len->getResultId());
		builder.createLoopMerge(merge, header, 0);
		builder.createConditionalBranch(cmp->getResultId(), header, merge);
	}

	builder.setBuildPoint(merge);
	auto *loaded_result = builder.addInstruction(type_id, spv::OpLoad);
	loaded_result->addIdOperand(output_id);

	builder.makeReturn(false, loaded_result->getResultId());

	builder.setBuildPoint(current_build_point);
	coop_mat_conv_ids.push_back({ type_id, type_id, func->getId(), HelperCall::CoopMatClamp });
	return func->getId();
}